

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void Test_Template_WeirdSyntax::Run(void)

{
  char *pcVar1;
  Template *pTVar2;
  TemplateDictionary dict;
  undefined1 local_a0 [32];
  TemplateDictionary local_80 [112];
  
  local_a0._0_8_ = "dict";
  local_a0._8_8_ = 4;
  local_a0[0x10] = true;
  local_a0._24_8_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_80,(TemplateString *)local_a0,(UnsafeArena *)0x0);
  pcVar1 = local_a0 + 0x10;
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"hi {{{! VAR {{!VAR} }} lo","")
  ;
  pTVar2 = ctemplate::StringToTemplate((string *)local_a0,STRIP_WHITESPACE);
  if ((char *)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"hi { lo","");
  ctemplate::AssertExpandIs(pTVar2,local_80,(string *)local_a0,true);
  if ((char *)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"fn(){{{BI_NEWLINE}} x=4;{{BI_NEWLINE}}}","");
  pTVar2 = ctemplate::StringToTemplate((string *)local_a0,DO_NOT_STRIP);
  if ((char *)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"fn(){\n x=4;\n}","");
  ctemplate::AssertExpandIs(pTVar2,local_80,(string *)local_a0,true);
  if ((char *)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"{{{{{{VAR}}}}}}}}","");
  pTVar2 = ctemplate::StringToTemplate((string *)local_a0,DO_NOT_STRIP);
  if ((char *)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"{{{{}}}}}}","");
  ctemplate::AssertExpandIs(pTVar2,local_80,(string *)local_a0,true);
  if ((char *)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(local_80);
  return;
}

Assistant:

bool IntEqVerbose(int a, int b) {
  if (a != b) {
    printf("EXPECTED: %d\n", a);
    printf("ACTUAL: %d\n", b);
    return false;
  }
  return true;
}